

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O3

void __thiscall QSharedMemoryPrivate::~QSharedMemoryPrivate(QSharedMemoryPrivate *this)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QSharedMemoryPrivate_00695f70;
  visit<QSharedMemoryPrivate::destructBackend()::_lambda(auto:1)_1_>(this,&local_11);
  QSystemSemaphore::~QSystemSemaphore(&this->systemSemaphore);
  pDVar1 = (this->errorString).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->errorString).d.d)->super_QArrayData,2,0x10);
    }
  }
  QNativeIpcKey::~QNativeIpcKey(&this->nativeKey);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSharedMemoryPrivate::~QSharedMemoryPrivate()
{
    destructBackend();
}